

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptMemoryDumper.cpp
# Opt level: O0

void __thiscall
ScriptMemoryDumper::DumpLargeHeapBlock(ScriptMemoryDumper *this,LargeHeapBlock *heapBlock)

{
  size_t sVar1;
  LargeObjectHeader *pLVar2;
  LargeObjectHeader *heapHeader;
  uint32 i;
  LargeHeapBlock *heapBlock_local;
  ScriptMemoryDumper *this_local;
  
  if (heapBlock != (LargeHeapBlock *)0x0) {
    (this->current).finalizeCount = heapBlock->finalizeCount + (this->current).finalizeCount;
    sVar1 = Memory::LargeHeapBlock::GetPageCount(heapBlock);
    (this->current).pageCount = sVar1 + (this->current).pageCount;
    sVar1 = Memory::LargeHeapBlock::GetPageCount(heapBlock);
    (this->current).totalByteCount = sVar1 * 0x1000 + (this->current).totalByteCount;
    for (heapHeader._4_4_ = 0; heapHeader._4_4_ < heapBlock->allocCount;
        heapHeader._4_4_ = heapHeader._4_4_ + 1) {
      pLVar2 = Memory::LargeHeapBlock::GetHeaderByIndex(heapBlock,heapHeader._4_4_);
      if (pLVar2 != (LargeObjectHeader *)0x0) {
        (this->current).activeObjectCount = (this->current).activeObjectCount + 1;
        (this->current).activeObjectByteSize =
             pLVar2->objectSize + (this->current).activeObjectByteSize;
      }
    }
  }
  return;
}

Assistant:

void ScriptMemoryDumper::DumpLargeHeapBlock(LargeHeapBlock* heapBlock)
{
    if (heapBlock == nullptr)
        return;

    current.finalizeCount += heapBlock->finalizeCount;
    current.pageCount += heapBlock->GetPageCount();
    current.totalByteCount += heapBlock->GetPageCount() * AutoSystemInfo::PageSize;

    for (uint32 i = 0; i < heapBlock->allocCount; i++)
    {
        Memory::LargeObjectHeader* heapHeader = heapBlock->GetHeaderByIndex(i);
        if (heapHeader != nullptr)
        {
            current.activeObjectCount++;
            current.activeObjectByteSize += heapHeader->objectSize;
        }
    }
}